

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O2

utf8proc_ssize_t
seqindex_write_char_decomposed
          (utf8proc_uint16_t seqindex,utf8proc_int32_t *dst,utf8proc_ssize_t bufsize,
          utf8proc_option_t options,int *last_boundclass)

{
  utf8proc_int32_t uc;
  ulong uVar1;
  utf8proc_ssize_t uVar2;
  undefined6 in_register_0000003a;
  ulong uVar3;
  long lVar4;
  utf8proc_uint16_t *entry;
  
  uVar1 = (ulong)((uint)CONCAT62(in_register_0000003a,seqindex) & 0x1fff);
  entry = utf8proc_sequences + uVar1;
  uVar3 = CONCAT62(in_register_0000003a,seqindex) >> 0xd & 0x7ffff;
  if ((int)uVar3 == 7) {
    uVar3 = (ulong)*entry;
    entry = utf8proc_sequences + uVar1 + 1;
  }
  lVar4 = 0;
  while( true ) {
    if ((int)uVar3 < 0) {
      return lVar4;
    }
    uc = seqindex_decode_entry(&entry);
    uVar2 = bufsize - lVar4;
    if (uVar2 == 0 || bufsize < lVar4) {
      uVar2 = 0;
    }
    uVar2 = utf8proc_decompose_char(uc,dst + lVar4,uVar2,options,last_boundclass);
    lVar4 = lVar4 + uVar2;
    if (lVar4 < 0) break;
    entry = entry + 1;
    uVar3 = (ulong)((int)uVar3 - 1);
  }
  return -2;
}

Assistant:

static utf8proc_ssize_t seqindex_write_char_decomposed(utf8proc_uint16_t seqindex, utf8proc_int32_t *dst, utf8proc_ssize_t bufsize, utf8proc_option_t options, int *last_boundclass) {
  utf8proc_ssize_t written = 0;
  const utf8proc_uint16_t *entry = &utf8proc_sequences[seqindex & 0x1FFF];
  int len = seqindex >> 13;
  if (len >= 7) {
    len = *entry;
    entry++;
  }
  for (; len >= 0; entry++, len--) {
    utf8proc_int32_t entry_cp = seqindex_decode_entry(&entry);

    written += utf8proc_decompose_char(entry_cp, dst+written,
      (bufsize > written) ? (bufsize - written) : 0, options,
    last_boundclass);
    if (written < 0) return UTF8PROC_ERROR_OVERFLOW;
  }
  return written;
}